

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O3

void threads_stop(lzma_stream_coder_conflict1 *coder,_Bool wait_for_threads)

{
  worker_thread *pwVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  if (coder->threads_initialized != 0) {
    lVar3 = 0x160;
    uVar4 = 0;
    do {
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)((long)&coder->threads->state + lVar3));
      if (iVar2 != 0) goto LAB_0069c6f0;
      pwVar1 = coder->threads;
      *(undefined4 *)((long)pwVar1 + lVar3 + -0x160) = 3;
      iVar2 = pthread_cond_signal((pthread_cond_t *)((long)&pwVar1->allocator + lVar3));
      if (iVar2 != 0) {
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0x10c,"void mythread_cond_signal(mythread_cond *)");
      }
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)((long)&coder->threads->state + lVar3));
      if (iVar2 != 0) goto LAB_0069c70f;
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x1c0;
    } while (uVar4 < coder->threads_initialized);
    if (wait_for_threads && coder->threads_initialized != 0) {
      uVar4 = 0;
      do {
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)&coder->threads[uVar4].mutex);
        if (iVar2 != 0) {
LAB_0069c6f0:
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
        }
        while (pwVar1 = coder->threads, pwVar1[uVar4].state != THR_IDLE) {
          iVar2 = pthread_cond_wait((pthread_cond_t *)&pwVar1[uVar4].cond,
                                    (pthread_mutex_t *)&pwVar1[uVar4].mutex);
          if (iVar2 != 0) {
            __assert_fail("ret == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                          ,0x114,"void mythread_cond_wait(mythread_cond *, mythread_mutex *)");
          }
        }
        iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&pwVar1[uVar4].mutex);
        if (iVar2 != 0) {
LAB_0069c70f:
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < coder->threads_initialized);
    }
  }
  return;
}

Assistant:

static void
threads_stop(lzma_stream_coder *coder, bool wait_for_threads)
{
	// Tell the threads to stop.
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			coder->threads[i].state = THR_STOP;
			mythread_cond_signal(&coder->threads[i].cond);
		}
	}

	if (!wait_for_threads)
		return;

	// Wait for the threads to settle in the idle state.
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			while (coder->threads[i].state != THR_IDLE)
				mythread_cond_wait(&coder->threads[i].cond,
						&coder->threads[i].mutex);
		}
	}

	return;
}